

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

string * __thiscall pbrt::InstanceSceneEntity::ToString_abi_cxx11_(InstanceSceneEntity *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  AnimatedTransform *args_2;
  long in_RSI;
  string *in_RDI;
  Transform *in_stack_ffffffffffffff88;
  FileLoc *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc8;
  byte bVar1;
  allocator<char> in_stack_ffffffffffffffcf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x88);
  args_2 = (AnimatedTransform *)(in_RSI + 0xa0);
  bVar1 = 0;
  if (*(long *)(in_RSI + 0x358) == 0) {
    std::allocator<char>::allocator();
    bVar1 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT17(in_stack_ffffffffffffffcf,CONCAT16(1,in_stack_ffffffffffffffc8)),
               (allocator<char> *)in_stack_ffffffffffffffc0);
  }
  else {
    Transform::ToString_abi_cxx11_(in_stack_ffffffffffffff88);
  }
  StringPrintf<std::__cxx11::string_const&,pbrt::FileLoc_const&,pbrt::AnimatedTransform_const&,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffffcf,CONCAT16(bVar1,in_stack_ffffffffffffffc8)),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,args_2,args_3);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  return in_RDI;
}

Assistant:

std::string ToString() const {
        return StringPrintf(
            "[ InstanceSeneEntity name: %s loc: %s "
            "renderFromInstanceAnim: %s renderFromInstance: %s ]",
            name, loc, renderFromInstanceAnim,
            renderFromInstance ? renderFromInstance->ToString() : std::string("nullptr"));
    }